

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  Node *this_00;
  StringPtr name_00;
  StringPtr name_01;
  bool bVar1;
  ulong uVar2;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  member;
  Reader params;
  StringPtr local_138;
  Node *local_128;
  ArrayPtr<const_char> local_120;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_110;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_a0;
  
  local_138.content.size_ = name.content.size_;
  local_138.content.ptr = name.content.ptr;
  resolveMember((Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                 *)&local_a0,this,name);
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  ::NullableValue(&local_110,&local_a0);
  if (local_110.isSet == true) {
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue(&__return_storage_ptr__->ptr,&local_110.field_1.value);
  }
  else {
    local_128 = this;
    Declaration::Reader::getParameters((Reader *)&local_a0,&this->declaration);
    uVar2 = 0;
    do {
      if ((uint)local_a0.field_1._16_4_ == uVar2) {
        this_00 = (local_128->parent).ptr;
        if (this_00 != (Node *)0x0) {
          name_00.content.size_ = local_138.content.size_;
          name_00.content.ptr = local_138.content.ptr;
          resolve(__return_storage_ptr__,this_00,name_00);
          return __return_storage_ptr__;
        }
        name_01.content.size_ = local_138.content.size_;
        name_01.content.ptr = local_138.content.ptr;
        local_110.field_1._32_8_ =
             Compiler::Impl::lookupBuiltin(local_128->module->compiler,name_01);
        if ((Node *)local_110.field_1._32_8_ != (Node *)0x0) {
          local_110.field_1._0_8_ = ((Node *)local_110.field_1._32_8_)->id;
          local_110.field_1._8_4_ = ((Node *)local_110.field_1._32_8_)->genericParamCount;
          local_110.field_1._24_2_ = ((Node *)local_110.field_1._32_8_)->kind;
          local_110.field_1._16_8_ = 0;
          local_110.field_1._40_1_ = 0;
          local_110.isSet = true;
          local_110._1_3_ = 0;
          kj::_::
          NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
          ::NullableValue(&__return_storage_ptr__->ptr,
                          (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                           *)&local_110);
          return __return_storage_ptr__;
        }
        (__return_storage_ptr__->ptr).isSet = false;
        return __return_storage_ptr__;
      }
      capnp::_::ListReader::getStructElement
                ((StructReader *)&local_110,(ListReader *)&local_a0,(ElementCount)uVar2);
      local_120 = (ArrayPtr<const_char>)
                  Declaration::BrandParameter::Reader::getName((Reader *)&local_110);
      bVar1 = kj::StringPtr::operator==((StringPtr *)&local_120,&local_138);
      uVar2 = uVar2 + 1;
    } while (!bVar1);
    local_110.field_1._0_8_ = local_128->id;
    local_110.field_1._8_4_ = (int)uVar2 + -1;
    local_110.isSet = true;
    local_110._1_3_ = 0;
    kj::_::
    NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::NullableValue(&__return_storage_ptr__->ptr,
                    (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                     *)&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_MAYBE(member, resolveMember(name)) {
    return *member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_MAYBE(p, parent) {
    return p->resolve(name);
  } else KJ_IF_MAYBE(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b->id, b->genericParamCount, 0, b->kind, b, nullptr });
    return result;
  } else {
    return nullptr;
  }
}